

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

int32_t __thiscall helics::InputInfo::getProperty(InputInfo *this,int32_t option)

{
  pointer piVar1;
  byte bVar2;
  
  if (option == 0x18d) {
    bVar2 = this->required;
  }
  else if (option == 0x192) {
    bVar2 = this->required ^ 1;
  }
  else if (option == 0x197) {
    bVar2 = this->required_connnections == 1;
  }
  else if (option == 0x199) {
    bVar2 = this->required_connnections != 1;
  }
  else if (option == 0x19e) {
    bVar2 = this->strict_type_matching;
  }
  else if (option == 0x1c6) {
    bVar2 = this->only_update_on_change;
  }
  else {
    if (option == 0x22d) {
      return (int32_t)((this->minTimeGap).internalTimeCode / 1000000);
    }
    if (option == 0x1fe) {
      piVar1 = (this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start == piVar1) {
        return -1;
      }
      return piVar1[-1];
    }
    if (option == 0x200) {
      bVar2 = (this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    }
    else {
      if (option == 0x20a) {
        return (int32_t)((ulong)((long)(this->input_sources).
                                       super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->input_sources).
                                      super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 3);
      }
      if (option == 0x1db) {
        bVar2 = this->not_interruptible;
      }
      else {
        bVar2 = 0;
      }
    }
  }
  return (int32_t)bVar2;
}

Assistant:

int32_t InputInfo::getProperty(int32_t option) const
{
    bool flagval = false;
    switch (option) {
        case defs::Options::IGNORE_INTERRUPTS:
            flagval = not_interruptible;
            break;
        case defs::Options::HANDLE_ONLY_UPDATE_ON_CHANGE:
            flagval = only_update_on_change;
            break;
        case defs::Options::CONNECTION_REQUIRED:
            flagval = required;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            flagval = !required;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            flagval = (required_connnections == 1);
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            flagval = (required_connnections != 1);
            break;
        case defs::Options::STRICT_TYPE_CHECKING:
            flagval = strict_type_matching;
            break;
        case defs::Options::CONNECTIONS:
            return static_cast<int32_t>(input_sources.size());
        case defs::Options::INPUT_PRIORITY_LOCATION:
            return priority_sources.empty() ? -1 : priority_sources.back();
        case defs::Options::CLEAR_PRIORITY_LIST:
            flagval = priority_sources.empty();
            break;
        case defs::Options::TIME_RESTRICTED:
            return static_cast<std::int32_t>(minTimeGap.to_ms().count());
        default:
            break;
    }
    return flagval ? 1 : 0;
}